

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O3

void INT_EVclient_ready_for_shutdown(EVclient client)

{
  FILE *__stream;
  int iVar1;
  __pid_t _Var2;
  pthread_t pVar3;
  CMFormat format;
  timespec ts;
  timespec local_28;
  
  if (client->already_shutdown != 0) {
    return;
  }
  if (client->cm->CMTrace_file == (FILE *)0x0) {
    iVar1 = CMtrace_init(client->cm,EVdfgVerbose);
    if (iVar1 == 0) goto LAB_00144596;
  }
  else if (CMtrace_val[0xd] == 0) goto LAB_00144596;
  if (CMtrace_PID != 0) {
    __stream = (FILE *)client->cm->CMTrace_file;
    _Var2 = getpid();
    pVar3 = pthread_self();
    fprintf(__stream,"P%lxT%lx - ",(long)_Var2,pVar3);
  }
  if (CMtrace_timing != 0) {
    clock_gettime(1,&local_28);
    fprintf((FILE *)client->cm->CMTrace_file,"%lld.%.9ld - ",
            CONCAT44(local_28.tv_sec._4_4_,(undefined4)local_28.tv_sec),local_28.tv_nsec);
  }
  fprintf((FILE *)client->cm->CMTrace_file,"Client %d ready for shutdown \n",
          (ulong)(uint)client->my_node_id);
LAB_00144596:
  fflush((FILE *)client->cm->CMTrace_file);
  if (client->master_connection == (CMConnection)0x0) {
    possibly_signal_shutdown(client->master,-1,(CMConnection)0x0);
  }
  else {
    format = INT_CMlookup_format(client->cm,EVclient_shutdown_contribution_format_list);
    local_28.tv_sec._0_4_ = 0xffffffff;
    INT_CMwrite(client->master_connection,format,&local_28);
  }
  return;
}

Assistant:

extern void
INT_EVclient_ready_for_shutdown(EVclient client)
{
    if (client->already_shutdown) return;
    CMtrace_out(client->cm, EVdfgVerbose, "Client %d ready for shutdown \n", client->my_node_id);
    if (client->master_connection != NULL) {
	/* we are a client, tell the master to shutdown */
	CMFormat shutdown_msg = INT_CMlookup_format(client->cm, EVclient_shutdown_contribution_format_list);
	EVshutdown_contribution_msg msg;
	msg.value = STATUS_NO_CONTRIBUTION;   /* no status contribution */
	INT_CMwrite(client->master_connection, shutdown_msg, &msg);
    } else {
	possibly_signal_shutdown(client->master, STATUS_NO_CONTRIBUTION, NULL);
    }
}